

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

int Sfm_MffcRef_rec(Abc_Obj_t *pObj,Vec_Int_t *vMffc)

{
  Abc_Obj_t *pObj_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  
  dVar5 = Mio_GateReadArea((Mio_Gate_t *)(pObj->field_5).pData);
  iVar3 = (int)((float)dVar5 * 1000.0);
  for (lVar4 = 0; lVar4 < (pObj->vFanins).nSize; lVar4 = lVar4 + 1) {
    pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar4]];
    iVar2 = (pObj_00->vFanouts).nSize;
    (pObj_00->vFanouts).nSize = iVar2 + 1;
    if (((iVar2 == 0) && (uVar1 = *(uint *)&pObj_00->field_0x14 & 0xf, uVar1 != 2)) && (uVar1 != 5))
    {
      iVar2 = Sfm_MffcRef_rec(pObj_00,vMffc);
      iVar3 = iVar3 + iVar2;
    }
  }
  if (vMffc != (Vec_Int_t *)0x0) {
    Vec_IntPush(vMffc,pObj->Id);
  }
  return iVar3;
}

Assistant:

int Sfm_MffcRef_rec( Abc_Obj_t * pObj, Vec_Int_t * vMffc )
{
    Abc_Obj_t * pFanin;
    int i, Area = Scl_Flt2Int(Mio_GateReadArea((Mio_Gate_t *)pObj->pData));
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        if ( pFanin->vFanouts.nSize++ == 0 && !Abc_ObjIsCi(pFanin) )
            Area += Sfm_MffcRef_rec( pFanin, vMffc );
    }
    if ( vMffc )
        Vec_IntPush( vMffc, Abc_ObjId(pObj) );
    return Area;
}